

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

void udp_start_rx(udp_ep *ep)

{
  void *pvVar1;
  undefined1 local_20 [8];
  nni_iov iov;
  udp_ep *ep_local;
  
  iov.iov_len = (size_t)ep;
  nni_msg_insert(ep->rx_payload,(void *)0x0,0x14);
  local_20 = (undefined1  [8])nni_msg_body(*(nni_msg **)(iov.iov_len + 0x400));
  iov.iov_buf = (void *)nni_msg_len(*(nni_msg **)(iov.iov_len + 0x400));
  pvVar1 = nni_msg_body(*(nni_msg **)(iov.iov_len + 0x400));
  *(void **)(iov.iov_len + 0xa28) = pvVar1;
  nni_msg_trim(*(nni_msg **)(iov.iov_len + 0x400),0x14);
  nni_aio_set_input((nni_aio *)(iov.iov_len + 0x658),0,(void *)(iov.iov_len + 0x408));
  nni_aio_set_iov((nni_aio *)(iov.iov_len + 0x658),1,(nni_iov *)local_20);
  nni_plat_udp_recv(*(nni_plat_udp **)iov.iov_len,(nni_aio *)(iov.iov_len + 0x658));
  return;
}

Assistant:

static void
udp_start_rx(udp_ep *ep)
{
	nni_iov iov;

	// We use this trick to collect the message header so that we can
	// do the entire message in a single iov, which avoids the need to
	// scatter/gather (which can be problematic for platforms that cannot
	// do scatter/gather due to missing recvmsg.)
	(void) nni_msg_insert(ep->rx_payload, NULL, sizeof(udp_sp_msg));
	iov.iov_buf = nni_msg_body(ep->rx_payload);
	iov.iov_len = nni_msg_len(ep->rx_payload);
	ep->rx_msg  = nni_msg_body(ep->rx_payload);
	nni_msg_trim(ep->rx_payload, sizeof(udp_sp_msg));

	nni_aio_set_input(&ep->rx_aio, 0, &ep->rx_sa);
	nni_aio_set_iov(&ep->rx_aio, 1, &iov);
	nni_udp_recv(ep->udp, &ep->rx_aio);
}